

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

void __thiscall ethash_check_difficulty_check::test_method(ethash_check_difficulty_check *this)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  bool bVar4;
  byte bVar5;
  ethash_h256_t target;
  size_type __dnew;
  size_type __dnew_1;
  byte local_228 [40];
  long *local_200;
  long local_1f8;
  long local_1f0 [2];
  undefined **local_1e0;
  ulong local_1d8;
  shared_count sStack_1d0;
  long **local_1c8;
  char **local_1c0;
  long *local_1b8;
  long *local_1b0 [2];
  long local_1a0;
  byte local_198 [8];
  undefined8 local_190;
  shared_count sStack_188;
  undefined **local_180;
  undefined1 local_178;
  undefined8 *local_170;
  char *local_168;
  undefined **local_160;
  undefined1 local_158;
  undefined ***local_150;
  char *local_148;
  long *local_140;
  char **local_138;
  undefined **local_130;
  undefined1 local_128;
  undefined ***local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined **local_50;
  undefined1 local_48;
  undefined ***local_40;
  ulong **local_38;
  
  local_228[0x10] = '2';
  local_228[0x11] = '2';
  local_228[0x12] = '2';
  local_228[0x13] = '2';
  local_228[0x14] = '2';
  local_228[0x15] = '2';
  local_228[0x16] = '2';
  local_228[0x17] = '2';
  local_228[0x18] = '2';
  local_228[0x19] = '2';
  local_228[0x1a] = '2';
  local_228[0x1b] = '2';
  local_228[0x1c] = '2';
  local_228[0x1d] = '2';
  local_228[0x1e] = '2';
  local_228[0x1f] = '2';
  local_228[0] = 0x32;
  local_228[1] = 0x32;
  local_228[2] = 0x32;
  local_228[3] = 0x32;
  local_228[4] = 0x32;
  local_228[5] = 0x32;
  local_228[6] = 0x32;
  local_228[7] = 0x32;
  local_228[8] = 0x32;
  local_228[9] = 0x32;
  local_228[10] = 0x32;
  local_228[0xb] = 0x32;
  local_228[0xc] = 0x32;
  local_228[0xd] = 0x32;
  local_228[0xe] = 0x32;
  local_228[0xf] = 0x32;
  local_60 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0xbd);
  if (local_228[0] == 0x31) {
    bVar5 = 0x31;
    uVar1 = 0;
    do {
      uVar2 = uVar1;
      bVar4 = 0x1e < uVar2;
      if (uVar2 == 0x1f) goto LAB_0011e947;
      bVar3 = "11111111111111111111111111111111"[uVar2 + 1];
      bVar5 = local_228[uVar2 + 1];
      uVar1 = uVar2 + 1;
    } while (bVar3 == bVar5);
    bVar4 = 0x1e < uVar2;
  }
  else {
    bVar3 = 0x31;
    bVar4 = false;
    bVar5 = local_228[0];
  }
  bVar5 = bVar3 < bVar5;
LAB_0011e947:
  local_198[0] = bVar4 | bVar5 & 1;
  local_190 = 0;
  sStack_188.pi_ = (sp_counted_base *)0x0;
  local_178 = 0;
  local_180 = &PTR__lazy_ostream_0013e750;
  local_170 = &boost::unit_test::lazy_ostream::inst;
  local_168 = "\nexpected \"";
  local_200 = (long *)0x20;
  local_1c0 = (char **)local_1b0;
  local_1c0 = (char **)std::__cxx11::string::_M_create((ulong *)&local_1c0,(ulong)&local_200);
  local_1b0[0] = local_200;
  ((long **)local_1c0)[2] = (long *)0x3131313131313131;
  ((long **)local_1c0)[3] = (long *)0x3131313131313131;
  *local_1c0 = (char *)0x3131313131313131;
  ((long **)local_1c0)[1] = (long *)0x3131313131313131;
  local_1b8 = local_200;
  *(char *)((long)local_1c0 + (long)local_200) = '\0';
  local_38 = (ulong **)&local_138;
  local_150 = &local_50;
  local_48 = 0;
  local_50 = &PTR__lazy_ostream_0013e8d0;
  local_40 = &local_180;
  local_158 = 0;
  local_160 = &PTR__lazy_ostream_0013efd0;
  local_148 = "\" to have the same or less difficulty than \"";
  local_1a0 = 0x20;
  local_200 = local_1f0;
  local_138 = local_1c0;
  local_200 = (long *)std::__cxx11::string::_M_create((ulong *)&local_200,(ulong)&local_1a0);
  local_1f0[0] = local_1a0;
  local_200[2] = 0x3232323232323232;
  local_200[3] = 0x3232323232323232;
  *(undefined4 *)local_200 = 0x32323232;
  builtin_strncpy((char *)((long)local_200 + 4),"2222",4);
  *(undefined4 *)(local_200 + 1) = 0x32323232;
  builtin_strncpy((char *)((long)local_200 + 0xc),"2222",4);
  local_1f8 = local_1a0;
  *(char *)((long)local_200 + local_1a0) = '\0';
  local_1c8 = &local_140;
  local_120 = &local_1e0;
  local_1d8 = local_1d8 & 0xffffffffffffff00;
  local_1e0 = &PTR__lazy_ostream_0013f010;
  sStack_1d0.pi_ = (sp_counted_base *)&local_160;
  local_128 = 0;
  local_130 = &PTR__lazy_ostream_0013f050;
  local_118 = "\"\n";
  local_80 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_78 = "";
  local_140 = local_200;
  boost::test_tools::tt_detail::report_assertion(local_198,&local_130,&local_80,0xbd,2,1,0);
  if (local_200 != local_1f0) {
    operator_delete(local_200);
  }
  if ((long **)local_1c0 != local_1b0) {
    operator_delete(local_1c0);
  }
  boost::detail::shared_count::~shared_count(&sStack_188);
  local_90 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_88 = "";
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_90,0xbf);
  local_1e0._0_1_ = 1;
  local_1d8 = 0;
  sStack_1d0.pi_ = (sp_counted_base *)0x0;
  local_128 = 0;
  local_130 = &PTR__lazy_ostream_0013ea10;
  local_120 = (undefined ***)&boost::unit_test::lazy_ostream::inst;
  local_118 = "";
  local_b0 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_a8 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1d0);
  local_228[0] = '1';
  local_228[1] = '1';
  local_228[2] = '1';
  local_228[3] = '1';
  local_228[4] = '1';
  local_228[5] = '1';
  local_228[6] = '1';
  local_228[7] = '1';
  local_228[8] = '1';
  local_228[9] = '1';
  local_228[10] = '1';
  local_228[0xb] = '1';
  local_228[0xc] = '1';
  local_228[0xd] = '1';
  local_228[0xe] = '1';
  local_228[0xf] = '1';
  local_228[0x10] = 0x31;
  local_228[0x11] = 0x31;
  local_228[0x12] = 0x31;
  local_228[0x13] = 0x31;
  local_228[0x14] = 0x31;
  local_228[0x15] = 0x31;
  local_228[0x16] = 0x31;
  local_228[0x17] = 0x31;
  local_228[0x18] = 0x31;
  local_228[0x19] = 0x31;
  local_228[0x1a] = 0x31;
  local_228[0x1b] = 0x31;
  local_228[0x1c] = 0x31;
  local_228[0x1d] = 0x31;
  local_228[0x1e] = 0x31;
  local_228[0x1f] = 0x32;
  local_c0 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0xc3);
  if (local_228[0] == 0x31) {
    bVar5 = 0x31;
    uVar1 = 0;
    do {
      uVar2 = uVar1;
      bVar4 = 0x1e < uVar2;
      if (uVar2 == 0x1f) goto LAB_0011ec86;
      bVar3 = "11111111111111111111111111111111"[uVar2 + 1];
      bVar5 = local_228[uVar2 + 1];
      uVar1 = uVar2 + 1;
    } while (bVar3 == bVar5);
    bVar4 = 0x1e < uVar2;
  }
  else {
    bVar3 = 0x31;
    bVar4 = false;
    bVar5 = local_228[0];
  }
  bVar5 = bVar3 < bVar5;
LAB_0011ec86:
  local_1e0._0_1_ = bVar4 | bVar5 & 1;
  local_1d8 = 0;
  sStack_1d0.pi_ = (sp_counted_base *)0x0;
  local_128 = 0;
  local_130 = &PTR__lazy_ostream_0013ea10;
  local_120 = (undefined ***)&boost::unit_test::lazy_ostream::inst;
  local_118 = "";
  local_e0 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_d8 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1d0);
  local_228[0] = '1';
  local_228[1] = '1';
  local_228[2] = '1';
  local_228[3] = '1';
  local_228[4] = '1';
  local_228[5] = '1';
  local_228[6] = '1';
  local_228[7] = '1';
  local_228[8] = '1';
  local_228[9] = '1';
  local_228[10] = '1';
  local_228[0xb] = '1';
  local_228[0xc] = '1';
  local_228[0xd] = '1';
  local_228[0xe] = '1';
  local_228[0xf] = '1';
  local_228[0x10] = 0x31;
  local_228[0x11] = 0x31;
  local_228[0x12] = 0x31;
  local_228[0x13] = 0x31;
  local_228[0x14] = 0x31;
  local_228[0x15] = 0x31;
  local_228[0x16] = 0x31;
  local_228[0x17] = 0x31;
  local_228[0x18] = 0x31;
  local_228[0x19] = 0x31;
  local_228[0x1a] = 0x31;
  local_228[0x1b] = 0x31;
  local_228[0x1c] = 0x31;
  local_228[0x1d] = 0x31;
  local_228[0x1e] = 0x31;
  local_228[0x1f] = 0x30;
  local_f0 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f0,199);
  if (local_228[0] == 0x31) {
    bVar5 = 0x31;
    uVar1 = 0;
    do {
      uVar2 = uVar1;
      bVar4 = 0x1e < uVar2;
      if (uVar2 == 0x1f) goto LAB_0011ed71;
      bVar3 = "11111111111111111111111111111111"[uVar2 + 1];
      bVar5 = local_228[uVar2 + 1];
      uVar1 = uVar2 + 1;
    } while (bVar3 == bVar5);
    bVar4 = 0x1e < uVar2;
  }
  else {
    bVar3 = 0x31;
    bVar4 = false;
    bVar5 = local_228[0];
  }
  bVar5 = bVar3 < bVar5;
LAB_0011ed71:
  local_1e0 = (undefined **)(CONCAT71(local_1e0._1_7_,~(bVar4 | bVar5)) & 0xffffffffffffff01);
  local_1d8 = 0;
  sStack_1d0.pi_ = (sp_counted_base *)0x0;
  local_128 = 0;
  local_130 = &PTR__lazy_ostream_0013ea10;
  local_120 = (undefined ***)&boost::unit_test::lazy_ostream::inst;
  local_118 = "";
  local_110 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_108 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1d0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(ethash_check_difficulty_check) {
	ethash_h256_t hash;
	ethash_h256_t target;
	memcpy(&hash, "11111111111111111111111111111111", 32);
	memcpy(&target, "22222222222222222222222222222222", 32);
	BOOST_REQUIRE_MESSAGE(
			ethash_check_difficulty(&hash, &target),
			"\nexpected \"" << std::string((char *) &hash, 32).c_str() << "\" to have the same or less difficulty than \"" << std::string((char *) &target, 32).c_str() << "\"\n");
	BOOST_REQUIRE_MESSAGE(
		ethash_check_difficulty(&hash, &hash), "");
			// "\nexpected \"" << hash << "\" to have the same or less difficulty than \"" << hash << "\"\n");
	memcpy(&target, "11111111111111111111111111111112", 32);
	BOOST_REQUIRE_MESSAGE(
		ethash_check_difficulty(&hash, &target), "");
			// "\nexpected \"" << hash << "\" to have the same or less difficulty than \"" << target << "\"\n");
	memcpy(&target, "11111111111111111111111111111110", 32);
	BOOST_REQUIRE_MESSAGE(
			!ethash_check_difficulty(&hash, &target), "");
			// "\nexpected \"" << hash << "\" to have more difficulty than \"" << target << "\"\n");
}